

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.cpp
# Opt level: O0

void __thiscall CRIPEMD160::Finalize(CRIPEMD160 *this,uchar *hash)

{
  uchar *in_RSI;
  CRIPEMD160 *in_RDI;
  long in_FS_OFFSET;
  uchar sizedesc [8];
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uchar *ptr;
  CRIPEMD160 *this_00;
  uchar local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = local_10;
  this_00 = in_RDI;
  WriteLE64(ptr,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  Write(this_00,in_RSI,(size_t)in_RDI);
  Write(this_00,in_RSI,(size_t)in_RDI);
  WriteLE32(ptr,in_stack_ffffffffffffffcc);
  WriteLE32(ptr,in_stack_ffffffffffffffcc);
  WriteLE32(ptr,in_stack_ffffffffffffffcc);
  WriteLE32(ptr,in_stack_ffffffffffffffcc);
  WriteLE32(ptr,in_stack_ffffffffffffffcc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRIPEMD160::Finalize(unsigned char hash[OUTPUT_SIZE])
{
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    WriteLE64(sizedesc, bytes << 3);
    Write(pad, 1 + ((119 - (bytes % 64)) % 64));
    Write(sizedesc, 8);
    WriteLE32(hash, s[0]);
    WriteLE32(hash + 4, s[1]);
    WriteLE32(hash + 8, s[2]);
    WriteLE32(hash + 12, s[3]);
    WriteLE32(hash + 16, s[4]);
}